

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O2

iterator * __thiscall LineReader<true>::iterator::operator++(iterator *this)

{
  bool bVar1;
  size_t sVar2;
  string local_38;
  
  bVar1 = File::atEnd(this->f_);
  if (bVar1) {
    this->offset_ = -1;
  }
  else {
    sVar2 = File::tell(this->f_);
    this->offset_ = sVar2;
    File::readLine_abi_cxx11_(&local_38,this->f_);
    std::__cxx11::string::operator=((string *)&this->line,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

iterator& operator++()
        {
            if (f_.atEnd())
                offset_ = -1;
            else {
                offset_ = f_.tell();
                line = f_.readLine();
            }
            return *this;
        }